

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

void __thiscall CLOptions::~CLOptions(CLOptions *this)

{
  pointer pcVar1;
  pointer poVar2;
  _Rb_tree_node_base *p_Var3;
  
  this->_vptr_CLOptions = (_func_int **)&PTR__CLOptions_00114c58;
  for (p_Var3 = (this->params_bools)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->params_bools)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (*(long **)(p_Var3 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var3 + 2) + 8))();
    }
  }
  for (p_Var3 = (this->params_doubles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->params_doubles)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (*(long **)(p_Var3 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var3 + 2) + 8))();
    }
  }
  for (p_Var3 = (this->params_ints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->params_ints)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (*(long **)(p_Var3 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var3 + 2) + 8))();
    }
  }
  for (p_Var3 = (this->params_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->params_strings)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (*(long **)(p_Var3 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var3 + 2) + 8))();
    }
  }
  pcVar1 = (this->program_desc_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->program_desc_).field_2) {
    operator_delete(pcVar1);
  }
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~CLParam(&(this->version_opt).
            super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          );
  pcVar1 = (this->configfile_comment)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->configfile_comment).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->configfile_opt_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->configfile_opt_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->version_str)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->version_str).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->help_str)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->help_str).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
  ::~_Rb_tree(&(this->params_strings)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
  ::~_Rb_tree(&(this->params_ints)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
  ::~_Rb_tree(&(this->params_doubles)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
  ::~_Rb_tree(&(this->params_bools)._M_t);
  poVar2 = (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (poVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(poVar2);
  return;
}

Assistant:

virtual ~CLOptions()
    {
        // Loop through each storage map and delete all objects
        std::map<std::string, CLBool*>::iterator bool_itr ;
        for (bool_itr=params_bools.begin(); bool_itr!=params_bools.end(); ++bool_itr)
            if (bool_itr->second != 0) delete bool_itr->second ;
        
        std::map<std::string, CLDouble*>::iterator dbl_itr;
        for (dbl_itr=params_doubles.begin(); dbl_itr!=params_doubles.end(); ++dbl_itr)
            if (dbl_itr->second != 0) delete dbl_itr->second ;
        
        std::map<std::string, CLInt*>::iterator int_itr;
        for (int_itr=params_ints.begin(); int_itr!=params_ints.end(); ++int_itr)
            if (int_itr->second != 0) delete int_itr->second ;
        
        std::map<std::string, CLString*>::iterator str_itr ;
        for (str_itr=params_strings.begin(); str_itr!=params_strings.end(); ++str_itr)
            if (str_itr->second != 0) delete str_itr->second ;
    }